

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O0

void __thiscall
CoreML::Specification::ResizeBilinearLayerParams::InternalSwap
          (ResizeBilinearLayerParams *this,ResizeBilinearLayerParams *other)

{
  ResizeBilinearLayerParams *other_local;
  ResizeBilinearLayerParams *this_local;
  
  google::protobuf::internal::InternalMetadata::InternalSwap
            (&(this->super_MessageLite)._internal_metadata_,
             &(other->super_MessageLite)._internal_metadata_);
  google::protobuf::RepeatedField<unsigned_long>::InternalSwap
            (&this->targetsize_,&other->targetsize_);
  std::swap<CoreML::Specification::SamplingMode*>(&this->mode_,&other->mode_);
  return;
}

Assistant:

void ResizeBilinearLayerParams::InternalSwap(ResizeBilinearLayerParams* other) {
  using std::swap;
  _internal_metadata_.InternalSwap(&other->_internal_metadata_);
  targetsize_.InternalSwap(&other->targetsize_);
  swap(mode_, other->mode_);
}